

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::quath>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,quath *v)

{
  half hVar1;
  bool bVar2;
  value_type *pvVar3;
  optional<tinyusdz::value::quath> local_64;
  undefined1 local_5a [8];
  optional<tinyusdz::value::quath> pv_1;
  undefined1 local_42 [8];
  optional<tinyusdz::value::quath> pv;
  quath *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (quath *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_005ffff8;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)&pv.contained,t);
  bVar2 = tinyusdz::value::TimeCode::is_default((TimeCode *)&pv.contained);
  if (bVar2) {
    get_default_value<tinyusdz::value::quath>
              ((optional<tinyusdz::value::quath> *)((long)&pv_1.contained + 4),this);
    nonstd::optional_lite::optional<tinyusdz::value::quath>::optional<tinyusdz::value::quath,_0>
              ((optional<tinyusdz::value::quath> *)local_42,
               (optional<tinyusdz::value::quath> *)((long)&pv_1.contained + 4));
    nonstd::optional_lite::optional<tinyusdz::value::quath>::~optional
              ((optional<tinyusdz::value::quath> *)((long)&pv_1.contained + 4));
    pv_1.contained._0_1_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_42);
    if ((bool)pv_1.contained._0_1_) {
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::quath>::value
                         ((optional<tinyusdz::value::quath> *)local_42);
      hVar1.value = (pvVar3->real).value;
      v->imag = (half3)(pvVar3->imag)._M_elems[0];
      v->real = (half)hVar1.value;
      this_local._7_1_ = 1;
    }
    pv_1.contained._1_3_ = 0;
    nonstd::optional_lite::optional<tinyusdz::value::quath>::~optional
              ((optional<tinyusdz::value::quath> *)local_42);
    if (pv_1.contained._0_4_ != 0) goto LAB_005ffff8;
    bVar2 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar2) {
      this_local._7_1_ = 0;
      goto LAB_005ffff8;
    }
  }
  bVar2 = has_timesamples(this);
  if (bVar2) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<tinyusdz::value::quath,_nullptr>(&this->_ts,v,t,tinterp);
  }
  else {
    bVar2 = has_default(this);
    if (bVar2) {
      get_default_value<tinyusdz::value::quath>(&local_64,this);
      nonstd::optional_lite::optional<tinyusdz::value::quath>::optional<tinyusdz::value::quath,_0>
                ((optional<tinyusdz::value::quath> *)local_5a,&local_64);
      nonstd::optional_lite::optional<tinyusdz::value::quath>::~optional(&local_64);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_5a);
      if (bVar2) {
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::quath>::value
                           ((optional<tinyusdz::value::quath> *)local_5a);
        hVar1.value = (pvVar3->real).value;
        v->imag = (half3)(pvVar3->imag)._M_elems[0];
        v->real = (half)hVar1.value;
        this_local._7_1_ = 1;
      }
      pv_1.contained._1_3_ = 0;
      pv_1.contained._0_1_ = bVar2;
      nonstd::optional_lite::optional<tinyusdz::value::quath>::~optional
                ((optional<tinyusdz::value::quath> *)local_5a);
      if (pv_1.contained._0_4_ != 0) goto LAB_005ffff8;
    }
    this_local._7_1_ = 0;
  }
LAB_005ffff8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }